

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

void lyxp_vars_free(lyxp_var *vars)

{
  char *local_28;
  char *local_18;
  uint64_t u;
  lyxp_var *vars_local;
  
  if (vars != (lyxp_var *)0x0) {
    local_18 = (char *)0x0;
    while( true ) {
      if (vars == (lyxp_var *)0x0) {
        local_28 = (char *)0x0;
      }
      else {
        local_28 = vars[-1].value;
      }
      if (local_28 <= local_18) break;
      free(vars[(long)local_18].name);
      free(vars[(long)local_18].value);
      local_18 = local_18 + 1;
    }
    if (vars != (lyxp_var *)0x0) {
      free(&vars[-1].value);
    }
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyxp_vars_free(struct lyxp_var *vars)
{
    LY_ARRAY_COUNT_TYPE u;

    if (!vars) {
        return;
    }

    LY_ARRAY_FOR(vars, u) {
        free(vars[u].name);
        free(vars[u].value);
    }

    LY_ARRAY_FREE(vars);
}